

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O0

void __thiscall miniros::Duration::Duration(Duration *this,Rate *rate)

{
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_20 [32];
  
  Rate::expectedCycleTime((Rate *)(local_20 + 8));
  Rate::expectedCycleTime((Rate *)local_20);
  DurationBase<miniros::Duration>::DurationBase
            ((DurationBase<miniros::Duration> *)CONCAT44(in_stack_ffffffffffffffd4,local_20._8_4_),
             (int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  ~Duration((Duration *)0x55b0fc);
  ~Duration((Duration *)0x55b106);
  return;
}

Assistant:

Duration::Duration(const Rate& rate)
    : DurationBase<Duration>(rate.expectedCycleTime().sec, rate.expectedCycleTime().nsec)
  { }